

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mainFrame.c
# Opt level: O1

void Abc_FrameSetCurrentNetwork(Abc_Frame_t *p,Abc_Ntk_t *pNtkNew)

{
  Abc_Ntk_t *pAVar1;
  int iVar2;
  char *__nptr;
  int iVar3;
  Abc_Ntk_t *pAVar4;
  Abc_Ntk_t *pNtk;
  
  if (p->pNtkCur != pNtkNew) {
    pNtkNew->pNetBackup = p->pNtkCur;
    iVar2 = p->nSteps + 1;
    p->nSteps = iVar2;
    pNtkNew->iStep = iVar2;
    p->pNtkCur = pNtkNew;
    __nptr = Cmd_FlagReadByName(p,"savesteps");
    if (__nptr == (char *)0x0) {
      iVar2 = 1;
    }
    else {
      iVar2 = atoi(__nptr);
    }
    iVar3 = -1;
    pNtk = (Abc_Ntk_t *)0x0;
    pAVar1 = p->pNtkCur;
    if (p->pNtkCur == (Abc_Ntk_t *)0x0) {
      pAVar4 = (Abc_Ntk_t *)0x0;
    }
    else {
      do {
        pAVar4 = pNtk;
        pNtk = pAVar1;
        iVar3 = iVar3 + 1;
        pAVar1 = pNtk->pNetBackup;
      } while (pNtk->pNetBackup != (Abc_Ntk_t *)0x0);
    }
    if (iVar2 < iVar3) {
      Abc_NtkDelete(pNtk);
      pAVar4->pNetBackup = (Abc_Ntk_t *)0x0;
    }
  }
  return;
}

Assistant:

void Abc_FrameSetCurrentNetwork( Abc_Frame_t * p, Abc_Ntk_t * pNtkNew )
{
    Abc_Ntk_t * pNtk, * pNtk2, * pNtk3;
    int nNetsPresent;
    int nNetsToSave;
    char * pValue;

    if ( p->pNtkCur == pNtkNew )
        return;

    // link it to the previous network
    Abc_NtkSetBackup( pNtkNew, p->pNtkCur );
    // set the step of this network
    Abc_NtkSetStep( pNtkNew, ++p->nSteps );
    // set this network to be the current network
    p->pNtkCur = pNtkNew;

    // remove any extra network that may happen to be in the stack
    pValue = Cmd_FlagReadByName( p, "savesteps" );
    // if the value of steps to save is not set, assume 1-level undo
    if ( pValue == NULL )
        nNetsToSave = 1;
    else 
        nNetsToSave = atoi(pValue);
    
    // count the network, remember the last one, and the one before the last one
    nNetsPresent = 0;
    pNtk2 = pNtk3 = NULL;
    for ( pNtk = p->pNtkCur; pNtk; pNtk = Abc_NtkBackup(pNtk2) )
    {
        nNetsPresent++;
        pNtk3 = pNtk2;
        pNtk2 = pNtk;
    }

    // remove the earliest backup network if it is more steps away than we store
    if ( nNetsPresent - 1 > nNetsToSave )
    { // delete the last network
        Abc_NtkDelete( pNtk2 );
        // clean the pointer of the network before the last one
        Abc_NtkSetBackup( pNtk3, NULL );
    }
}